

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O1

void P_FreeStrifeConversations(void)

{
  FStrifeDialogueNode *this;
  PClass *pPVar1;
  DMenu *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  
  while (StrifeDialogues.Count != 0) {
    StrifeDialogues.Count = StrifeDialogues.Count - 1;
    this = StrifeDialogues.Array[StrifeDialogues.Count];
    if (this != (FStrifeDialogueNode *)0x0) {
      FStrifeDialogueNode::~FStrifeDialogueNode(this);
      operator_delete(this,0x50);
    }
  }
  M_Free(DialogueRoots.Nodes);
  DialogueRoots.Size = 0;
  DialogueRoots.NumUsed = 0;
  DialogueRoots.Nodes = (Node *)0x0;
  DialogueRoots.LastFree = (Node *)0x0;
  TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::SetNodeVector(&DialogueRoots,1);
  M_Free(ClassRoots.Nodes);
  ClassRoots.Size = 0;
  ClassRoots.NumUsed = 0;
  ClassRoots.Nodes = (Node *)0x0;
  ClassRoots.LastFree = (Node *)0x0;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::SetNodeVector(&ClassRoots,1);
  pDVar2 = DMenu::CurrentMenu;
  pPVar1 = DConversationMenu::RegistrationInfo.MyClass;
  PrevNode = (FStrifeDialogueNode *)0x0;
  if (DMenu::CurrentMenu != (DMenu *)0x0) {
    if ((DMenu::CurrentMenu->super_DObject).Class == (PClass *)0x0) {
      iVar3 = (**(DMenu::CurrentMenu->super_DObject)._vptr_DObject)(DMenu::CurrentMenu);
      (pDVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar4 = (pDVar2->super_DObject).Class;
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
      return;
    }
  }
  return;
}

Assistant:

void P_FreeStrifeConversations ()
{
	FStrifeDialogueNode *node;

	while (StrifeDialogues.Pop (node))
	{
		delete node;
	}

	DialogueRoots.Clear();
	ClassRoots.Clear();

	PrevNode = NULL;
	if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DConversationMenu)))
	{
		DMenu::CurrentMenu->Close();
	}
}